

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void dnsExit(void)

{
  puts("Usage:");
  printf(
        "    .\\dns [-opt ...]             # interactive mode using default server,file and cache size \n     .\\dns [-opt ...] -d number   # interactive mode using debug number lever \n    .\\dns [-opt ...] -f file     # interactive mode using this file as dnsrelay \n    .\\dns [-opt ...] -s server   # interactive mode using \'server\' \n    .\\dns [-opt ...] -c number   # interactive mode using the number size of cache"
        );
  exit(0);
}

Assistant:

void dnsExit(){
  printf("Usage:\n");
  printf("    .\\dns [-opt ...]             # interactive mode using default server,file and cache size \n "\
  "    .\\dns [-opt ...] -d number   # interactive mode using debug number lever \n"\
  "    .\\dns [-opt ...] -f file     # interactive mode using this file as dnsrelay \n"\
  "    .\\dns [-opt ...] -s server   # interactive mode using 'server' \n"\
  "    .\\dns [-opt ...] -c number   # interactive mode using the number size of cache");
  exit(0);
}